

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O1

double * __thiscall
std::__uninitialized_copy<true>::
__uninit_copy<ranges::basic_iterator<ranges::concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>::cursor<true>>,double*>
          (__uninitialized_copy<true> *this,
          basic_iterator<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>_>
          *__first,basic_iterator<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>_>
                   *__last,double *__result)

{
  ulong uVar1;
  double *pdVar2;
  undefined8 local_30;
  double *local_28;
  ulong local_20;
  basic_iterator<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>_>
  local_18;
  
  local_20 = 3;
  if (*(ulong *)(this + 0x10) < 3) {
    __result = *(double **)(this + 8);
    local_20 = *(ulong *)(this + 0x10);
  }
  local_30 = *(undefined8 *)this;
  uVar1 = (__first->
          super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
          ).
          super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
          .
          super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
          .
          super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
          .value.its_.index_;
  local_18.
  super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
  .value.its_.index_ = 3;
  if (uVar1 < 3) {
    this = *(__uninitialized_copy<true> **)
            &(__first->
             super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
             ).
             super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
             .
             super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
             .
             super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
             .value.its_.
             super_variant_data<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>
    ;
    local_18.
    super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
    .
    super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
    .
    super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
    .
    super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
    .value.its_.index_ = uVar1;
  }
  local_18.
  super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
  .value.rng_ = (__first->
                super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
                ).
                super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
                .
                super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
                .
                super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
                .value.rng_;
  if (local_20 < 3) {
    local_28 = __result;
  }
  if (local_18.
      super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
      .
      super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
      .
      super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
      .
      super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
      .value.its_.index_ < 3) {
    local_18.
    super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
    .
    super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
    .
    super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
    .
    super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
    .value.its_.
    super_variant_data<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>
    .field_0 = (anon_union_8_2_3194c211_for_type_0)this;
  }
  pdVar2 = __copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<ranges::basic_iterator<ranges::concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>::cursor<true>>,double*>
                     ((__copy_move<false,false,std::random_access_iterator_tag> *)&local_30,
                      &local_18,__last,__result);
  return pdVar2;
}

Assistant:

constexpr std::size_t index() const noexcept
        {
            return index_;
        }